

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

bool __thiscall draco::ObjEncoder::EncodeMaterialFileName(ObjEncoder *this)

{
  _Rb_tree_header *p_Var1;
  GeometryMetadata *this_00;
  EncoderBuffer *pEVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  AttributeMetadata *this_01;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  PointAttribute *pPVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  string material_file_name;
  string material_full_path;
  int value;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->in_point_cloud_->metadata_)._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (this_00 == (GeometryMetadata *)0x0) {
    this_01 = (AttributeMetadata *)0x0;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"material","");
    this_01 = GeometryMetadata::GetAttributeMetadataByStringEntry(this_00,&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (this_01 == (AttributeMetadata *)0x0) {
    bVar4 = true;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"file_name","");
    bVar4 = Metadata::GetEntryString(&this_01->super_Metadata,&local_50,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      pEVar2 = this->out_buffer_;
      if (pEVar2->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar2,
                   (pEVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,"mtllib ","");
        pEVar2 = this->out_buffer_;
        if (pEVar2->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar2,
                     (pEVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          pEVar2 = this->out_buffer_;
          if (pEVar2->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar2,
                       (pEVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,"\n","");
          }
        }
      }
      std::
      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->material_id_to_name_)._M_h);
      p_Var6 = (this_01->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      p_Var1 = &(this_01->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var6 != p_Var1) {
        do {
          _Var3._M_p = local_50._M_dataplus._M_p;
          local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffff00000000;
          if ((long)p_Var6[2]._M_parent - (long)*(undefined4 **)(p_Var6 + 2) == 4) {
            local_50._M_dataplus._M_p._4_4_ = SUB84(_Var3._M_p,4);
            local_50._M_dataplus._M_p._0_4_ = **(undefined4 **)(p_Var6 + 2);
            pmVar5 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->material_id_to_name_,(key_type *)&local_50);
            std::__cxx11::string::_M_assign((string *)pmVar5);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != p_Var1);
      }
      pPVar7 = PointCloud::GetAttributeByUniqueId(this->in_point_cloud_,this_01->att_unique_id_);
      this->material_att_ = pPVar7;
      if (pPVar7 != (PointAttribute *)0x0) {
        bVar4 = pPVar7->num_unique_entries_ != 0;
        goto LAB_001105c7;
      }
    }
    bVar4 = false;
  }
LAB_001105c7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool ObjEncoder::EncodeMaterialFileName() {
  const GeometryMetadata *pc_metadata = in_point_cloud_->GetMetadata();
  const AttributeMetadata *material_metadata = nullptr;
  if (pc_metadata) {
    material_metadata =
        pc_metadata->GetAttributeMetadataByStringEntry("name", "material");
  }
  std::string material_file_name;
  std::string material_full_path;
  if (!material_metadata) {
    return true;
  }
  if (!material_metadata->GetEntryString("file_name", &material_file_name))
    return false;
  buffer()->Encode("mtllib ", 7);
  buffer()->Encode(material_file_name.c_str(), material_file_name.size());
  buffer()->Encode("\n", 1);
  material_id_to_name_.clear();
  for (const auto &entry : material_metadata->entries()) {
    // Material id must be int.
    int value = 0;
    // Found entry that are not material id, e.g. file name as a string.
    if (!entry.second.GetValue(&value)) {
      continue;
    }
    material_id_to_name_[value] = entry.first;
  }
  material_att_ = in_point_cloud_->GetAttributeByUniqueId(
      material_metadata->att_unique_id());
  if (material_att_ == nullptr || material_att_->size() == 0) {
    return false;
  }
  return true;
}